

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitagg.cpp
# Opt level: O1

void duckdb::BitwiseOperation::
     Operation<duckdb::string_t,duckdb::BitState<duckdb::string_t>,duckdb::BitStringOrOperation>
               (BitState<duckdb::string_t> *state,string_t *input,AggregateUnaryInput *param_3)

{
  undefined4 uVar1;
  char *__src;
  char *__dest;
  string_t *in_RCX;
  ulong local_38;
  char *local_30;
  
  local_38 = *(ulong *)&input->value;
  __src = (input->value).pointer.ptr;
  if (state->is_set == false) {
    if ((uint)local_38 < 0xd) {
      *(ulong *)&(state->value).value = local_38;
      __dest = __src;
    }
    else {
      __dest = (char *)operator_new__(local_38 & 0xffffffff);
      memcpy(__dest,__src,local_38 & 0xffffffff);
      uVar1 = *(undefined4 *)__dest;
      (state->value).value.pointer.length = (uint)local_38;
      *(undefined4 *)((long)&(state->value).value + 4) = uVar1;
    }
    (state->value).value.pointer.ptr = __dest;
    state->is_set = true;
  }
  else {
    local_30 = __src;
    duckdb::Bit::BitwiseOr((Bit *)&local_38,&state->value,&state->value,in_RCX);
  }
  return;
}

Assistant:

static void Operation(STATE &state, const INPUT_TYPE &input, AggregateUnaryInput &) {
		if (!state.is_set) {
			OP::template Assign<INPUT_TYPE>(state, input);
			state.is_set = true;
		} else {
			OP::template Execute<INPUT_TYPE>(state, input);
		}
	}